

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata_test.cc
# Opt level: O3

void libaom_examples::anon_unknown_0::TestConversion(double v)

{
  internal iVar1;
  pointer *__ptr;
  SEARCH_METHODS *message;
  char *in_R9;
  DepthRepresentationElement e;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb1;
  char *abs_error_expr;
  AssertHelper local_40;
  double local_38;
  char local_30;
  undefined7 uStack_2f;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  DepthRepresentationElement local_10;
  
  local_38 = v;
  iVar1 = (internal)double_to_depth_representation_element(v,&local_10);
  abs_error_expr = (char *)0x0;
  if ((bool)iVar1) {
    depth_representation_element_to_double(&local_10);
    testing::internal::DoubleNearPredFormat
              ((char *)CONCAT71(in_stack_ffffffffffffffb1,iVar1),
               (char *)in_stack_ffffffffffffffa8._M_head_impl,abs_error_expr,
               (double)in_stack_ffffffffffffffe8,(double)in_stack_ffffffffffffffe0,
               (double)in_stack_ffffffffffffffd8);
    abs_error_expr = in_stack_ffffffffffffffd8;
    if (local_30 == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffffb0);
      if (abs_error_expr == (char *)0x0) {
        message = "";
      }
      else {
        message = *(SEARCH_METHODS **)abs_error_expr;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/multilayer_metadata_test.cc"
                 ,0xd4,(char *)message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)&stack0xffffffffffffffb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
      if ((long *)CONCAT71(in_stack_ffffffffffffffb1,iVar1) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(in_stack_ffffffffffffffb1,iVar1) + 8))();
      }
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    std::ostream::_M_insert<double>(local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_30,(internal *)&stack0xffffffffffffffb0,
               (AssertionResult *)"double_to_depth_representation_element(v, &e)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/multilayer_metadata_test.cc"
               ,0xd3,(char *)CONCAT71(uStack_2f,local_30));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((undefined1 *)CONCAT71(uStack_2f,local_30) != &stack0xffffffffffffffe0) {
      operator_delete((undefined1 *)CONCAT71(uStack_2f,local_30));
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffffa8._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa8._M_head_impl + 8))();
    }
  }
  if (abs_error_expr != (char *)0x0) {
    if (*(char **)abs_error_expr != abs_error_expr + 0x10) {
      operator_delete(*(char **)abs_error_expr);
    }
    operator_delete(abs_error_expr);
  }
  return;
}

Assistant:

void TestConversion(double v) {
  DepthRepresentationElement e;
  ASSERT_TRUE(double_to_depth_representation_element(v, &e)) << v;
  EXPECT_NEAR(depth_representation_element_to_double(e), v, 0.000000001);
}